

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *line,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
          basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
          CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  size_type sVar1;
  size_type sVar2;
  size_t sVar3;
  undefined1 compress_00;
  ulong __pos;
  ulong uStack_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined4 local_44;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  compress_00 = SUB81(sectionStartCharacters,0);
  local_40 = delimiterCharacters;
  local_38 = sectionStartCharacters;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     delimiterCharacters->_M_str,0,delimiterCharacters->_M_len);
  if (sVar1 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,this,line,
               (basic_string_view<char,_std::char_traits<char>_> *)((ulong)sectionMatch & 0xff),
               (bool)compress_00);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_44 = (int)sectionMatch;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,0,
                       line->_M_len);
    if (sVar2 == 0xffffffffffffffff) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this)
      ;
    }
    else {
      uStack_70 = 0;
      while (uStack_70 < *(ulong *)this) {
        if (sVar2 < sVar1) {
          if (sVar2 - uStack_70 == 0) {
            if ((byte)local_44 == '\0') {
              local_58 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)__return_storage_ptr__,&local_58);
            }
          }
          else {
            local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)this,uStack_70
                                  ,sVar2 - uStack_70);
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)__return_storage_ptr__,&local_58);
          }
          __pos = sVar2 + 1;
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,
                             __pos,line->_M_len);
        }
        else {
          sVar3 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                            (sVar1 + 1,(basic_string_view<char,_std::char_traits<char>_> *)this,
                             *(byte *)(*(long *)(this + 8) + sVar1),
                             *(char *)((long)&local_38->_M_len +
                                      (ulong)*(byte *)(*(long *)(this + 8) + sVar1)));
          if (sVar3 == 0xffffffffffffffff) {
            local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)this,uStack_70
                                  ,0xffffffffffffffff);
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)__return_storage_ptr__,&local_58);
            __pos = *(ulong *)this;
          }
          else {
            sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str
                               ,sVar3 + 1,line->_M_len);
            if (sVar1 == 0xffffffffffffffff) {
              local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                    uStack_70,0xffffffffffffffff);
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)__return_storage_ptr__,&local_58);
              __pos = 0xffffffffffffffff;
              sVar1 = __pos;
            }
            else {
              local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                    uStack_70,sVar1 - uStack_70);
              std::
              vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)__return_storage_ptr__,&local_58);
              __pos = sVar1 + 1;
              sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 local_40->_M_str,__pos,local_40->_M_len);
            }
            sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str
                               ,__pos,line->_M_len);
          }
        }
        uStack_70 = __pos;
        if ((__pos != 0xffffffffffffffff) && (sVar2 == 0xffffffffffffffff)) {
          uStack_70 = 0xffffffffffffffff;
          if (((byte)local_44 & *(ulong *)this <= __pos) == 0) {
            local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,
                                  0xffffffffffffffff);
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)__return_storage_ptr__,&local_58);
            uStack_70 = 0xffffffffffffffff;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}